

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmi2mid.cc
# Opt level: O2

size_t xmi_process_chunks(PBuffer *buffer,MidiFile *midi)

{
  element_type *peVar1;
  code *pcVar2;
  uint uVar3;
  Stream *pSVar4;
  iterator iVar5;
  allocator<char> local_f9;
  size_t size;
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> local_f0;
  PBuffer id;
  element_type *local_c0;
  undefined1 local_b8 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  PBuffer content;
  undefined1 local_80 [16];
  string name;
  string local_50 [32];
  
  while( true ) {
    peVar1 = (buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar1->size == 0) break;
    std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_f0,&buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>);
    Buffer::pop((Buffer *)&id,(size_t)local_f0._M_ptr);
    Buffer::operator_cast_to_string
              (&name,id.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    uVar3 = Buffer::pop<unsigned_int>(local_f0._M_ptr);
    size = (size_t)uVar3;
    std::__cxx11::string::string<std::allocator<char>>
              (local_50,"xmi2mid",(allocator<char> *)local_b8);
    Log::Logger::operator[]((Logger *)&content,(string *)&Log::Verbose);
    pSVar4 = Log::Stream::operator<<((Stream *)&content,"Processing XMI chunk: ");
    pSVar4 = Log::Stream::operator<<(pSVar4,&name);
    pSVar4 = Log::Stream::operator<<(pSVar4," (size: ");
    pSVar4 = Log::Stream::operator<<(pSVar4,&size);
    Log::Stream::operator<<(pSVar4,")");
    Log::Stream::~Stream((Stream *)&content);
    std::__cxx11::string::~string(local_50);
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_(*)(std::shared_ptr<Buffer>,_MidiFile_*)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_(*)(std::shared_ptr<Buffer>,_MidiFile_*)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_(*)(std::shared_ptr<Buffer>,_MidiFile_*)>_>_>
            ::find(&xmi_processors_abi_cxx11_._M_t,&name);
    if ((_Rb_tree_header *)iVar5._M_node ==
        &xmi_processors_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
      Buffer::pop((Buffer *)local_80,(size_t)local_f0._M_ptr);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
      std::__cxx11::string::string<std::allocator<char>>((string *)&content,"xmi2mid",&local_f9);
      Log::Logger::operator[]((Logger *)local_b8,(string *)&Log::Debug);
      pSVar4 = Log::Stream::operator<<((Stream *)local_b8,"Unknown XMI chunk: ");
      local_c0 = id.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      Log::Stream::operator<<(pSVar4,&local_c0);
      Log::Stream::~Stream((Stream *)local_b8);
      std::__cxx11::string::~string((string *)&content);
    }
    else {
      Buffer::pop((Buffer *)&content,(size_t)local_f0._M_ptr);
      pcVar2 = *(code **)(iVar5._M_node + 2);
      std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8),
                 (__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)&content);
      (*pcVar2)((__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8),midi);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&content.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    std::__cxx11::string::~string((string *)&name);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&id.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0._M_refcount);
    Buffer::get_tail((Buffer *)&name,
                     (size_t)(buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                    );
    std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)&name);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&name._M_string_length);
  }
  return (size_t)peVar1;
}

Assistant:

static size_t
xmi_process_chunks(PBuffer buffer, MidiFile *midi) {
  size_t length = buffer->get_size();

  while (buffer->get_size()) {
    size_t size = xmi_process_chunk(buffer, midi);
    buffer = buffer->get_tail(size);
  }

  return length;
}